

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase *
EvaluateFunction(ExpressionEvalContext *ctx,ExprFunctionDefinition *expression,ExprBase *context,
                ArrayView<ExprBase_*> arguments)

{
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *this;
  Node *pNVar1;
  StackFrame *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  StackFrame **ppSVar6;
  ExprPointerLiteral *pEVar7;
  ExprBase **ppEVar8;
  ExprBase *pEVar9;
  ExprBase *pEVar10;
  uint index;
  ExprVariableDefinition *pEVar11;
  IntrusiveList<ExprBase> *pIVar12;
  StackVariable local_58;
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *local_48;
  ArrayView<ExprBase_*> local_40;
  VariableData *pVVar5;
  
  local_40.data = arguments.data;
  local_40.count = arguments.count;
  bVar3 = AddInstruction(ctx);
  if (!bVar3) {
    return (ExprBase *)0x0;
  }
  if (ctx->stackDepthLimit <= (ctx->stackFrames).count) {
    Report(ctx,"ERROR: stack depth limit");
    return (ExprBase *)0x0;
  }
  this = &ctx->stackFrames;
  iVar4 = (*ctx->ctx->allocator->_vptr_Allocator[2])();
  pVVar5 = (VariableData *)CONCAT44(extraout_var,iVar4);
  pNVar1 = (Node *)ctx->ctx->allocator;
  pVVar5->source = (SynBase *)expression->function;
  memset(&pVVar5->alignment,0,0x200);
  pVVar5[1].offsetUsers.data = pNVar1;
  pVVar5->importModule = (ModuleData *)&pVVar5->alignment;
  pVVar5->scope = (ScopeData *)0x2000000000;
  pVVar5[1].offsetUsers.storage[1].key = 0;
  *(undefined8 *)pVVar5[1].offsetUsers.storage = 0;
  pVVar5[1].offsetUsers.storage[0].value = (VmConstant *)0x0;
  local_58.variable = pVVar5;
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::push_back(this,(StackFrame **)&local_58);
  local_48 = this;
  ppSVar6 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(this);
  pSVar2 = *ppSVar6;
  pEVar11 = expression->contextArgument;
  if (pEVar11 != (ExprVariableDefinition *)0x0) {
    pEVar7 = AllocateTypeStorage(ctx,(pEVar11->super_ExprBase).source,
                                 pEVar11->variable->variable->type);
    if (pEVar7 == (ExprPointerLiteral *)0x0) {
      return (ExprBase *)0x0;
    }
    local_58.variable = pEVar11->variable->variable;
    local_58.ptr = pEVar7;
    SmallArray<ExpressionEvalContext::StackVariable,_32U>::push_back(&pSVar2->variables,&local_58);
    bVar3 = CreateStore(ctx,&pEVar7->super_ExprBase,context);
    if (!bVar3) {
      return (ExprBase *)0x0;
    }
  }
  pEVar11 = (expression->arguments).head;
  index = 0;
  while (pEVar11 != (ExprVariableDefinition *)0x0) {
    pEVar7 = AllocateTypeStorage(ctx,(pEVar11->super_ExprBase).source,
                                 pEVar11->variable->variable->type);
    if (pEVar7 == (ExprPointerLiteral *)0x0) {
      return (ExprBase *)0x0;
    }
    local_58.variable = pEVar11->variable->variable;
    local_58.ptr = pEVar7;
    SmallArray<ExpressionEvalContext::StackVariable,_32U>::push_back(&pSVar2->variables,&local_58);
    ppEVar8 = ArrayView<ExprBase_*>::operator[](&local_40,index);
    bVar3 = CreateStore(ctx,&pEVar7->super_ExprBase,*ppEVar8);
    if (!bVar3) {
      return (ExprBase *)0x0;
    }
    pEVar11 = (ExprVariableDefinition *)(pEVar11->super_ExprBase).next;
    if ((pEVar11 == (ExprVariableDefinition *)0x0) || ((pEVar11->super_ExprBase).typeID != 0x1e)) {
      pEVar11 = (ExprVariableDefinition *)0x0;
    }
    index = index + 1;
  }
  if (expression->coroutineStateRead != (ExprBase *)0x0) {
    pEVar9 = Evaluate(ctx,expression->coroutineStateRead);
    if ((pEVar9 == (ExprBase *)0x0) || (pEVar9->typeID != 6)) {
      return (ExprBase *)0x0;
    }
    pSVar2->targetYield = *(uint *)&pEVar9[1]._vptr_ExprBase;
  }
  pIVar12 = &expression->expressions;
  do {
    pEVar9 = pIVar12->head;
    if (pEVar9 == (ExprBase *)0x0) {
      pEVar10 = pSVar2->returnValue;
      if (pEVar10 == (ExprBase *)0x0) {
        ReportCritical(ctx,"ERROR: function didn\'t return a value");
        return (ExprBase *)0x0;
      }
      break;
    }
    pEVar10 = Evaluate(ctx,pEVar9);
    if (pEVar10 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    if ((pSVar2->breakDepth != 0) || (pSVar2->continueDepth != 0)) {
      __assert_fail("frame->breakDepth == 0 && frame->continueDepth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,2000,
                    "ExprBase *EvaluateFunction(ExpressionEvalContext &, ExprFunctionDefinition *, ExprBase *, ArrayView<ExprBase *>)"
                   );
    }
    pEVar10 = pSVar2->returnValue;
    pIVar12 = (IntrusiveList<ExprBase> *)&pEVar9->next;
  } while (pEVar10 == (ExprBase *)0x0);
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::pop_back(local_48);
  return pEVar10;
}

Assistant:

ExprBase* EvaluateFunction(ExpressionEvalContext &ctx, ExprFunctionDefinition *expression, ExprBase *context, ArrayView<ExprBase*> arguments)
{
	if(!AddInstruction(ctx))
		return NULL;

	if(ctx.stackFrames.size() >= ctx.stackDepthLimit)
		return Report(ctx, "ERROR: stack depth limit");

	ctx.stackFrames.push_back(new (ctx.ctx.get<ExpressionEvalContext::StackFrame>()) ExpressionEvalContext::StackFrame(ctx.ctx.allocator, expression->function));

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(ExprVariableDefinition *curr = expression->contextArgument)
	{
		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, curr->source, curr->variable->variable->type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(curr->variable->variable, storage));

		if(!CreateStore(ctx, storage, context))
			return NULL;
	}

	unsigned pos = 0;

	for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
	{
		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, curr->source, curr->variable->variable->type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(curr->variable->variable, storage));

		if(!CreateStore(ctx, storage, arguments[pos]))
			return NULL;

		pos++;
	}

	if(expression->coroutineStateRead)
	{
		if(ExprIntegerLiteral *jmpOffset = getType<ExprIntegerLiteral>(Evaluate(ctx, expression->coroutineStateRead)))
		{
			frame->targetYield = unsigned(jmpOffset->value);
		}
		else
		{
			return NULL;
		}
	}

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		assert(frame->breakDepth == 0 && frame->continueDepth == 0);

		if(frame->returnValue)
			break;
	}

	ExprBase *result = frame->returnValue;

	if(!result)
		return ReportCritical(ctx, "ERROR: function didn't return a value");

	ctx.stackFrames.pop_back();

	return result;
}